

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

void set_cost(GridNode *node,GridNode *start,GridNode *target)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  iVar1 = (node->pos).x;
  iVar2 = (node->pos).y;
  uVar6 = (start->pos).x - iVar1;
  uVar3 = -uVar6;
  if (0 < (int)uVar6) {
    uVar3 = uVar6;
  }
  uVar5 = (start->pos).y - iVar2;
  uVar6 = -uVar5;
  if (0 < (int)uVar5) {
    uVar6 = uVar5;
  }
  uVar5 = uVar6;
  if (uVar3 < uVar6) {
    uVar5 = uVar3;
  }
  lVar7 = (ulong)uVar3 - (ulong)uVar6;
  lVar4 = -lVar7;
  if (0 < lVar7) {
    lVar4 = lVar7;
  }
  node->gCost = uVar5 * 0xe + (int)lVar4 * 10;
  uVar6 = (target->pos).x - iVar1;
  uVar3 = -uVar6;
  if (0 < (int)uVar6) {
    uVar3 = uVar6;
  }
  uVar5 = (target->pos).y - iVar2;
  uVar6 = -uVar5;
  if (0 < (int)uVar5) {
    uVar6 = uVar5;
  }
  uVar5 = uVar6;
  if (uVar3 < uVar6) {
    uVar5 = uVar3;
  }
  lVar7 = (ulong)uVar3 - (ulong)uVar6;
  lVar4 = -lVar7;
  if (0 < lVar7) {
    lVar4 = lVar7;
  }
  node->hCost = uVar5 * 0xe + (int)lVar4 * 10;
  return;
}

Assistant:

int get_distance_bw_nodes(GridNode *a, GridNode *b)
{
    int deltaX = absolute(a->pos.x - b->pos.x);
    int deltaY = absolute(a->pos.y - b->pos.y);
#if USE_ACCURATE_DIST
    int dist = (int)(sqrt((deltaX * deltaX) + (deltaY * deltaY)));
#else
    int dist = 14 * min(deltaX, deltaY) + 10 * (max(deltaX, deltaY) - min(deltaX, deltaY));
#endif
    return dist;
}